

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O2

void __thiscall
Lib::DArray<const_Lib::List<Kernel::Literal_*>_*>::DArray
          (DArray<const_Lib::List<Kernel::Literal_*>_*> *this,size_t size)

{
  void *placement;
  List<Kernel::Literal_*> **ppLVar1;
  
  this->_size = size;
  this->_capacity = size;
  if (size == 0) {
    ppLVar1 = (List<Kernel::Literal_*> **)0x0;
  }
  else {
    placement = Lib::alloc(size << 3);
    ppLVar1 = array_new<Lib::List<Kernel::Literal*>const*>(placement,this->_capacity);
  }
  this->_array = ppLVar1;
  return;
}

Assistant:

inline
  DArray (size_t size=0)
    : _size(size), _capacity(size)
  {
    if(size>0) {
      void* mem = ALLOC_KNOWN(sizeof(C)*_capacity,"DArray<>");
      _array = array_new<C>(mem, _capacity);
    } else {
      _array=0;
    }
  }